

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O3

void Qentem::Test::TestCopyValue1(QTest *test)

{
  QTest *pQVar1;
  Value<char> *pVVar2;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar3;
  SizeT32 i;
  Value<char> *pVVar4;
  QNumber64 QVar5;
  QNumber64 QVar6;
  QNumber64 QVar7;
  QNumber64 QVar8;
  bool bVar9;
  bool bVar10;
  ValueC value1;
  VString key;
  ObjectItem *h_arr_storage;
  ValueC *arr_storage;
  char *c_str_var;
  VHArray h_arr_var;
  VArray arr_var;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_c8;
  char local_b8;
  QNumber64 local_a8;
  ulong uStack_a0;
  QTest *local_98;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_90;
  Value<char> *local_88;
  QNumber64 local_80;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  local_78;
  char local_59;
  Array<Qentem::Value<char>_> local_58;
  QNumber64 local_40;
  undefined4 local_38;
  
  QVar5.Natural = (SizeT64)&local_c8;
  QVar6.Natural = (SizeT64)&local_c8;
  QVar7.Natural = (SizeT64)&local_c8;
  QVar8.Natural = (SizeT64)&local_c8;
  local_b8 = 0;
  local_c8.array_.storage_ = (Value<char> *)0x0;
  local_c8._8_8_ = 0;
  local_58.storage_ = (Value<char> *)0x0;
  local_58.index_ = 0;
  local_58.capacity_ = 0;
  local_78.hashTable_ = (SizeT *)0x0;
  local_78.index_ = 0;
  local_78.capacity_ = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\b';
  String<char>::String((String<char> *)&local_a8,"-ABCDEF0123456789ABCDEF0123456789-");
  operator_delete((void *)0x0);
  local_40 = local_a8;
  local_38 = (SizeT)uStack_a0;
  local_a8.Natural = 0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_80 = local_40;
  Value<char>::operator=((Value<char> *)&local_c8.array_,(StringT *)&local_40);
  if (local_b8 == '\x04') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == String;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(test,bVar9,0x8cf);
  for (; *(char *)(QVar5.Natural + 0x10) == '\x01'; QVar5.Natural = *QVar5.Natural) {
  }
  if (*(char *)(QVar5.Natural + 0x10) == '\x04') {
    local_a8.Natural = *QVar5.Natural;
  }
  else {
    local_a8.Natural = 0;
  }
  QTest::IsNotEqual<char_const*,char_const*>(test,(char **)&local_a8,(char **)&local_80,0x8d0);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_a8.Natural = 0;
  local_b8 = '\b';
  uStack_a0 = 0x100000000;
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  bVar10 = true;
  bVar9 = true;
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar9 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar9 = false;
    }
  }
  QTest::IsTrue(test,bVar9,0x8d9);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(test,paVar3,0x8da);
  QTest::IsNull(test,(void *)local_c8.number_,0x8db);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\b';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&local_58,3);
  local_88 = local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar10 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar10 = false;
    }
  }
  QTest::IsTrue(test,bVar10,0x8e4);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(test,paVar3,0x8e5);
  QTest::IsNotNull(test,(void *)local_c8.number_,0x8e6);
  local_a8.Natural = (SizeT64)local_c8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,(Value<char> **)&local_a8,&local_88,0x8e7);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\b';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)&local_a8,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(test,bVar9,0x8f0);
  pVVar4 = (Value<char> *)0x0;
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(test,paVar3,0x8f1);
  local_98 = test;
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNull(test,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                             (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x8f2);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\b';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  do {
    local_59 = (&DigitUtils::DigitTable2)[(long)pVVar4];
    local_a8.Natural = 0;
    uStack_a0 = uStack_a0 & 0xffffffff00000000;
    String<char>::Write((String<char> *)&local_a8,&local_59,1);
    pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78,
                        (Char_T *)local_a8,(SizeT)uStack_a0);
    Value<char>::reset(pVVar2);
    QVar5 = local_a8;
    (pVVar2->field_0).array_.storage_ = pVVar4;
    pVVar2->type_ = UIntLong;
    if ((Char_T *)local_a8.Natural != (Char_T *)0x0) {
      MemoryRecord::RemoveAllocation((void *)local_a8);
    }
    operator_delete((void *)QVar5);
    pVVar4 = (Value<char> *)
             ((long)&(pVVar4->field_0).object_.
                     super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                     .hashTable_ + 1);
  } while (pVVar4 != (Value<char> *)0x3);
  local_90 = (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)
             (local_78.hashTable_ + ((ulong)local_78._8_8_ >> 0x20));
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  pQVar1 = local_98;
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(local_98,bVar9,0x902);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x903);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                                  (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x904);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  local_a8.Natural =
       (long)&(local_c8.array_.storage_)->field_0 +
       (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4;
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (pQVar1,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&local_a8,&local_90,
             0x905);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\t';
  String<char>::String((String<char> *)&local_a8,"-ABCDEF0123456789ABCDEF0123456789-");
  QVar5 = local_40;
  if ((void *)local_40.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_40);
  }
  operator_delete((void *)QVar5);
  local_40 = local_a8;
  local_38 = (SizeT)uStack_a0;
  local_a8.Natural = 0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_80 = local_40;
  Value<char>::operator=((Value<char> *)&local_c8.array_,(StringT *)&local_40);
  if (local_b8 == '\x04') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == String;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x90f);
  for (; *(char *)(QVar6.Natural + 0x10) == '\x01'; QVar6.Natural = *QVar6.Natural) {
  }
  if (*(char *)(QVar6.Natural + 0x10) == '\x04') {
    local_a8.Natural = *QVar6.Natural;
  }
  else {
    local_a8.Natural = 0;
  }
  QTest::IsNotEqual<char_const*,char_const*>(pQVar1,(char **)&local_a8,(char **)&local_80,0x910);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_a8.Natural = 0;
  local_b8 = '\t';
  uStack_a0 = 0x100000000;
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  bVar10 = true;
  bVar9 = true;
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar9 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar9 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar9,0x919);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x91a);
  QTest::IsNull(pQVar1,(void *)local_c8.number_,0x91b);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\t';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&local_58,3);
  local_88 = local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar10 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar10 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar10,0x924);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x925);
  QTest::IsNotNull(pQVar1,(void *)local_c8.number_,0x926);
  local_a8.Natural = (SizeT64)local_c8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (pQVar1,(Value<char> **)&local_a8,&local_88,0x927);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\t';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)&local_a8,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x930);
  pVVar4 = (Value<char> *)0x0;
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x931);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                               (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x932);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\t';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  do {
    local_59 = (&DigitUtils::DigitTable2)[(long)pVVar4];
    local_a8.Natural = 0;
    uStack_a0 = uStack_a0 & 0xffffffff00000000;
    String<char>::Write((String<char> *)&local_a8,&local_59,1);
    pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78,
                        (Char_T *)local_a8,(SizeT)uStack_a0);
    Value<char>::reset(pVVar2);
    QVar5 = local_a8;
    (pVVar2->field_0).array_.storage_ = pVVar4;
    pVVar2->type_ = UIntLong;
    if ((Char_T *)local_a8.Natural != (Char_T *)0x0) {
      MemoryRecord::RemoveAllocation((void *)local_a8);
    }
    operator_delete((void *)QVar5);
    pVVar4 = (Value<char> *)
             ((long)&(pVVar4->field_0).object_.
                     super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                     .hashTable_ + 1);
  } while (pVVar4 != (Value<char> *)0x3);
  local_90 = (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)
             (local_78.hashTable_ + ((ulong)local_78._8_8_ >> 0x20));
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  pQVar1 = local_98;
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(local_98,bVar9,0x942);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x943);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                                  (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x944);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  local_a8.Natural =
       (long)&(local_c8.array_.storage_)->field_0 +
       (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4;
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (pQVar1,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&local_a8,&local_90,
             0x945);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\n';
  String<char>::String((String<char> *)&local_a8,"-ABCDEF0123456789ABCDEF0123456789-");
  QVar5 = local_40;
  if ((void *)local_40.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_40);
  }
  operator_delete((void *)QVar5);
  local_40 = local_a8;
  local_38 = (SizeT)uStack_a0;
  local_a8.Natural = 0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_80 = local_40;
  Value<char>::operator=((Value<char> *)&local_c8.array_,(StringT *)&local_40);
  if (local_b8 == '\x04') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == String;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x94f);
  for (; *(char *)(QVar7.Natural + 0x10) == '\x01'; QVar7.Natural = *QVar7.Natural) {
  }
  if (*(char *)(QVar7.Natural + 0x10) == '\x04') {
    local_a8.Natural = *QVar7.Natural;
  }
  else {
    local_a8.Natural = 0;
  }
  QTest::IsNotEqual<char_const*,char_const*>(pQVar1,(char **)&local_a8,(char **)&local_80,0x950);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_a8.Natural = 0;
  local_b8 = '\n';
  uStack_a0 = 0x100000000;
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  bVar10 = true;
  bVar9 = true;
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar9 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar9 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar9,0x959);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x95a);
  QTest::IsNull(pQVar1,(void *)local_c8.number_,0x95b);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\n';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&local_58,3);
  local_88 = local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar10 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar10 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar10,0x964);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x965);
  QTest::IsNotNull(pQVar1,(void *)local_c8.number_,0x966);
  local_a8.Natural = (SizeT64)local_c8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (pQVar1,(Value<char> **)&local_a8,&local_88,0x967);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\n';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)&local_a8,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x970);
  pVVar4 = (Value<char> *)0x0;
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x971);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                               (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x972);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = '\n';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  do {
    local_59 = (&DigitUtils::DigitTable2)[(long)pVVar4];
    local_a8.Natural = 0;
    uStack_a0 = uStack_a0 & 0xffffffff00000000;
    String<char>::Write((String<char> *)&local_a8,&local_59,1);
    pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78,
                        (Char_T *)local_a8,(SizeT)uStack_a0);
    Value<char>::reset(pVVar2);
    QVar5 = local_a8;
    (pVVar2->field_0).array_.storage_ = pVVar4;
    pVVar2->type_ = UIntLong;
    if ((Char_T *)local_a8.Natural != (Char_T *)0x0) {
      MemoryRecord::RemoveAllocation((void *)local_a8);
    }
    operator_delete((void *)QVar5);
    pVVar4 = (Value<char> *)
             ((long)&(pVVar4->field_0).object_.
                     super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                     .hashTable_ + 1);
  } while (pVVar4 != (Value<char> *)0x3);
  local_90 = (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)
             (local_78.hashTable_ + ((ulong)local_78._8_8_ >> 0x20));
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  pQVar1 = local_98;
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(local_98,bVar9,0x982);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x983);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                                  (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x984);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  local_a8.Natural =
       (long)&(local_c8.array_.storage_)->field_0 +
       (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4;
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (pQVar1,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&local_a8,&local_90,
             0x985);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_c8.number_ = (QNumber64)0x17;
  local_b8 = '\x06';
  String<char>::String((String<char> *)&local_a8,"-ABCDEF0123456789ABCDEF0123456789-");
  QVar5 = local_40;
  if ((void *)local_40.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_40);
  }
  operator_delete((void *)QVar5);
  local_40 = local_a8;
  local_38 = (SizeT)uStack_a0;
  local_a8.Natural = 0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_80 = local_40;
  Value<char>::operator=((Value<char> *)&local_c8.array_,(StringT *)&local_40);
  if (local_b8 == '\x04') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == String;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x98f);
  for (; *(char *)(QVar8.Natural + 0x10) == '\x01'; QVar8.Natural = *QVar8.Natural) {
  }
  if (*(char *)(QVar8.Natural + 0x10) == '\x04') {
    local_a8.Natural = *QVar8.Natural;
  }
  else {
    local_a8.Natural = 0;
  }
  QTest::IsNotEqual<char_const*,char_const*>(pQVar1,(char **)&local_a8,(char **)&local_80,0x990);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_a8.Natural = 0;
  local_c8.number_ = (QNumber64)0x21;
  local_b8 = '\x06';
  uStack_a0 = 0x100000000;
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  bVar10 = true;
  bVar9 = true;
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar9 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar9 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar9,0x999);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x99a);
  QTest::IsNull(pQVar1,(void *)local_c8.number_,0x99b);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_c8.number_ = (QNumber64)0x21;
  local_b8 = '\x06';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  Array<Qentem::Value<char>_>::operator=(&local_58,(Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_a8);
  Array<Qentem::Value<char>_>::ResizeAndInitialize(&local_58,3);
  local_88 = local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_c8.array_,&local_58);
  if (local_b8 != '\x03') {
    if (local_b8 == '\x01') {
      bVar10 = (local_c8.array_.storage_)->type_ == Array;
    }
    else {
      bVar10 = false;
    }
  }
  QTest::IsTrue(pQVar1,bVar10,0x9a4);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x03') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x9a5);
  QTest::IsNotNull(pQVar1,(void *)local_c8.number_,0x9a6);
  local_a8.Natural = (SizeT64)local_c8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (pQVar1,(Value<char> **)&local_a8,&local_88,0x9a7);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_c8.number_ = (QNumber64)0x22;
  local_b8 = '\x06';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)&local_a8,1);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(pQVar1,bVar9,0x9b0);
  pVVar4 = (Value<char> *)0x0;
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x9b1);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                               (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x9b2);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_c8.number_ = (QNumber64)0x22;
  local_b8 = '\x06';
  local_a8.Natural = 0;
  uStack_a0 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=(&local_78,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_a8);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8);
  do {
    local_59 = (&DigitUtils::DigitTable2)[(long)pVVar4];
    local_a8.Natural = 0;
    uStack_a0 = uStack_a0 & 0xffffffff00000000;
    String<char>::Write((String<char> *)&local_a8,&local_59,1);
    pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78,
                        (Char_T *)local_a8,(SizeT)uStack_a0);
    Value<char>::reset(pVVar2);
    QVar5 = local_a8;
    (pVVar2->field_0).array_.storage_ = pVVar4;
    pVVar2->type_ = UIntLong;
    if ((Char_T *)local_a8.Natural != (Char_T *)0x0) {
      MemoryRecord::RemoveAllocation((void *)local_a8);
    }
    operator_delete((void *)QVar5);
    pVVar4 = (Value<char> *)
             ((long)&(pVVar4->field_0).object_.
                     super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                     .hashTable_ + 1);
  } while (pVVar4 != (Value<char> *)0x3);
  local_90 = (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)
             (local_78.hashTable_ + ((ulong)local_78._8_8_ >> 0x20));
  Value<char>::operator=((Value<char> *)&local_c8.array_,(ObjectT *)&local_78);
  pQVar1 = local_98;
  if (local_b8 == '\x02') {
    bVar9 = true;
  }
  else if (local_b8 == '\x01') {
    bVar9 = (local_c8.array_.storage_)->type_ == Object;
  }
  else {
    bVar9 = false;
  }
  QTest::IsTrue(local_98,bVar9,0x9c2);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,paVar3,0x9c3);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  QTest::IsNotNull(pQVar1,(void *)((long)&(local_c8.array_.storage_)->field_0 +
                                  (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4),0x9c4);
  paVar3 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_b8 == '\x02') {
    paVar3 = &local_c8;
  }
  local_a8.Natural =
       (long)&(local_c8.array_.storage_)->field_0 +
       (ulong)*(uint *)((long)&paVar3->array_ + 0xc) * 4;
  QTest::
  IsNotEqual<Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*,Qentem::HAItem_T<Qentem::String<char>,Qentem::Value<char>>const*>
            (pQVar1,(HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> **)&local_a8,&local_90,
             0x9c5);
  Value<char>::reset((Value<char> *)&local_c8.array_);
  local_b8 = 0;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&local_78);
  Array<Qentem::Value<char>_>::~Array(&local_58);
  QVar5 = local_40;
  if ((void *)local_40.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_40);
  }
  operator_delete((void *)QVar5);
  Value<char>::~Value((Value<char> *)&local_c8.array_);
  return;
}

Assistant:

static void TestCopyValue1(QTest &test) {
    ValueC value1;

    // true
    // false
    // null

    VString     str_var;
    const char *c_str_var; // = str_var.First();

    VArray        arr_var;
    const ValueC *arr_storage; // = arr_var.First();

    VHArray           h_arr_var;
    const ObjectItem *h_arr_storage; // = h_arr_var.First();

    ////////////////////////////////////////////

    value1 = true;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = true;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = true;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = false;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = false;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = false;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = nullptr;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = nullptr;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = nullptr;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////

    value1 = 23;

    str_var   = VString{"-ABCDEF0123456789ABCDEF0123456789-"};
    c_str_var = str_var.First();
    value1    = str_var;
    test.IsTrue(value1.IsString(), __LINE__);
    test.IsNotEqual(value1.StringStorage(), c_str_var, __LINE__);
    value1.Reset();

    /////////////
    value1 = 33;

    // No values
    arr_var = VArray(1);
    value1  = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value1.GetArray()->First(), __LINE__);
    value1.Reset();
    value1 = 33;

    // Has values
    arr_var = VArray{};
    arr_var.ResizeAndInitialize(3);
    arr_storage = arr_var.First();
    value1      = arr_var;
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    value1.Reset();

    /////////////
    value1 = 34;

    // No values
    h_arr_var = VHArray(1);
    value1    = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNull(value1.GetObject()->First(), __LINE__);
    value1.Reset();
    value1 = 34;

    // Has values
    h_arr_var = VHArray{};

    for (SizeT32 i = 0; i < 3; i++) {
        VString key;

        Digit::NumberToString(key, i);
        h_arr_var[key] = i;
    }

    h_arr_storage = h_arr_var.First();
    value1        = h_arr_var;
    test.IsTrue(value1.IsObject(), __LINE__);
    test.IsNotNull(value1.GetObject(), __LINE__);
    test.IsNotNull(value1.GetObject()->First(), __LINE__);
    test.IsNotEqual(value1.GetObject()->First(), h_arr_storage, __LINE__);
    value1.Reset();

    ////////////////////////////////////////////
}